

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Decode.cpp
# Opt level: O0

void idx2::DecompressChunk(bitstream *ChunkStream,chunk_cache *ChunkCache,u64 ChunkAddress,int L)

{
  byte *pbVar1;
  char cVar2;
  int iVar3;
  ulong uVar4;
  int *local_478;
  int *BrickSzIt;
  int local_468;
  int I_1;
  i32 BrickSize;
  int I;
  u64 Brick;
  int NBricks;
  u64 Brk;
  int L_local;
  u64 ChunkAddress_local;
  chunk_cache *ChunkCache_local;
  bitstream *ChunkStream_local;
  int Shift_3;
  u64 Val_3;
  long lStack_3f0;
  int Shift_2;
  u64 Val_2;
  long lStack_3d8;
  int Shift_1;
  u64 Val_1;
  long lStack_3c0;
  int Shift;
  u64 Val;
  int local_38c;
  u32 V;
  u64 Result_4;
  u64 Result_1;
  u64 Result;
  u64 Result_3;
  u64 Result_2;
  u64 Result_6;
  u64 Result_5;
  u64 Result_8;
  u64 Result_7;
  u64 Remaining_7;
  u64 Remaining_8;
  u64 Remaining_5;
  u64 Remaining_6;
  u64 Remaining_2;
  u64 Remaining_3;
  u64 Remaining;
  u64 Remaining_1;
  u64 Remaining_4;
  
  (ChunkStream->Stream).Data = (ChunkStream->Stream).Data;
  (ChunkStream->Stream).Bytes = (ChunkStream->Stream).Bytes;
  (ChunkStream->Stream).Alloc = (ChunkStream->Stream).Alloc;
  ChunkStream->BitPtr = (ChunkStream->Stream).Data;
  ChunkStream->BitPos = 0;
  ChunkStream->BitBuf = 0;
  ChunkStream->BitPtr = ChunkStream->BitPtr + (ChunkStream->BitPos >> 3);
  ChunkStream->BitBuf = *(u64 *)ChunkStream->BitPtr;
  ChunkStream->BitPos = ChunkStream->BitPos & 7;
  lStack_3c0 = 0;
  cVar2 = '\0';
  do {
    if (0x40 < ChunkStream->BitPos + 7) {
      ChunkStream->BitPtr = ChunkStream->BitPtr + (ChunkStream->BitPos >> 3);
      ChunkStream->BitBuf = *(u64 *)ChunkStream->BitPtr;
      ChunkStream->BitPos = ChunkStream->BitPos & 7;
    }
    uVar4 = ChunkStream->BitBuf >> ((byte)ChunkStream->BitPos & 0x3f) & bitstream::Masks.Arr[7];
    ChunkStream->BitPos = ChunkStream->BitPos + 7;
    lStack_3c0 = (uVar4 << (cVar2 * '\a' & 0x3fU)) + lStack_3c0;
    if (0x40 < ChunkStream->BitPos + 1) {
      ChunkStream->BitPtr = ChunkStream->BitPtr + (ChunkStream->BitPos >> 3);
      ChunkStream->BitBuf = *(u64 *)ChunkStream->BitPtr;
      ChunkStream->BitPos = ChunkStream->BitPos & 7;
    }
    uVar4 = ChunkStream->BitBuf >> ((byte)ChunkStream->BitPos & 0x3f) & bitstream::Masks.Arr[1];
    ChunkStream->BitPos = ChunkStream->BitPos + 1;
    cVar2 = cVar2 + '\x01';
  } while (uVar4 != 0);
  iVar3 = (int)lStack_3c0;
  lStack_3d8 = 0;
  cVar2 = '\0';
  do {
    if (0x40 < ChunkStream->BitPos + 7) {
      ChunkStream->BitPtr = ChunkStream->BitPtr + (ChunkStream->BitPos >> 3);
      ChunkStream->BitBuf = *(u64 *)ChunkStream->BitPtr;
      ChunkStream->BitPos = ChunkStream->BitPos & 7;
    }
    uVar4 = ChunkStream->BitBuf >> ((byte)ChunkStream->BitPos & 0x3f) & bitstream::Masks.Arr[7];
    ChunkStream->BitPos = ChunkStream->BitPos + 7;
    _BrickSize = (uVar4 << (cVar2 * '\a' & 0x3fU)) + lStack_3d8;
    if (0x40 < ChunkStream->BitPos + 1) {
      ChunkStream->BitPtr = ChunkStream->BitPtr + (ChunkStream->BitPos >> 3);
      ChunkStream->BitBuf = *(u64 *)ChunkStream->BitPtr;
      ChunkStream->BitPos = ChunkStream->BitPos & 7;
    }
    uVar4 = ChunkStream->BitBuf >> ((byte)ChunkStream->BitPos & 0x3f) & bitstream::Masks.Arr[1];
    ChunkStream->BitPos = ChunkStream->BitPos + 1;
    lStack_3d8 = _BrickSize;
    cVar2 = cVar2 + '\x01';
  } while (uVar4 != 0);
  Resize<unsigned_long>(&ChunkCache->Bricks,(long)iVar3);
  *(long *)(ChunkCache->Bricks).Buffer.Data = _BrickSize;
  for (I_1 = 1; I_1 != iVar3; I_1 = I_1 + 1) {
    local_38c = 0;
    while( true ) {
      if (0x40 < ChunkStream->BitPos + 1) {
        ChunkStream->BitPtr = ChunkStream->BitPtr + (ChunkStream->BitPos >> 3);
        ChunkStream->BitBuf = *(u64 *)ChunkStream->BitPtr;
        ChunkStream->BitPos = ChunkStream->BitPos & 7;
      }
      uVar4 = ChunkStream->BitBuf >> ((byte)ChunkStream->BitPos & 0x3f) & bitstream::Masks.Arr[1];
      ChunkStream->BitPos = ChunkStream->BitPos + 1;
      if (uVar4 != 0) break;
      local_38c = local_38c + 1;
    }
    _BrickSize = (ulong)(local_38c + 1) + _BrickSize;
    *(long *)((ChunkCache->Bricks).Buffer.Data + (long)I_1 * 8) = _BrickSize;
  }
  Resize<int>(&ChunkCache->BrickOffsets,(long)iVar3);
  local_468 = 0;
  ChunkStream->BitPtr =
       ChunkStream->BitPtr +
       (long)((ChunkStream->Stream).Data +
             ((long)(ChunkStream->BitPos + 7 >> 3) - (long)(ChunkStream->Stream).Data));
  ChunkStream->BitBuf = *(u64 *)ChunkStream->BitPtr;
  ChunkStream->BitPos = 0;
  pbVar1 = (ChunkCache->BrickOffsets).Buffer.Data;
  pbVar1[0] = '\0';
  pbVar1[1] = '\0';
  pbVar1[2] = '\0';
  pbVar1[3] = '\0';
  for (BrickSzIt._4_4_ = 1; (long)BrickSzIt._4_4_ != (ChunkCache->BrickOffsets).Size;
      BrickSzIt._4_4_ = BrickSzIt._4_4_ + 1) {
    lStack_3f0 = 0;
    cVar2 = '\0';
    do {
      if (0x40 < ChunkStream->BitPos + 7) {
        ChunkStream->BitPtr = ChunkStream->BitPtr + (ChunkStream->BitPos >> 3);
        ChunkStream->BitBuf = *(u64 *)ChunkStream->BitPtr;
        ChunkStream->BitPos = ChunkStream->BitPos & 7;
      }
      uVar4 = ChunkStream->BitBuf >> ((byte)ChunkStream->BitPos & 0x3f) & bitstream::Masks.Arr[7];
      ChunkStream->BitPos = ChunkStream->BitPos + 7;
      lStack_3f0 = (uVar4 << (cVar2 * '\a' & 0x3fU)) + lStack_3f0;
      if (0x40 < ChunkStream->BitPos + 1) {
        ChunkStream->BitPtr = ChunkStream->BitPtr + (ChunkStream->BitPos >> 3);
        ChunkStream->BitBuf = *(u64 *)ChunkStream->BitPtr;
        ChunkStream->BitPos = ChunkStream->BitPos & 7;
      }
      uVar4 = ChunkStream->BitBuf >> ((byte)ChunkStream->BitPos & 0x3f) & bitstream::Masks.Arr[1];
      ChunkStream->BitPos = ChunkStream->BitPos + 1;
      cVar2 = cVar2 + '\x01';
    } while (uVar4 != 0);
    local_468 = (int)lStack_3f0 + local_468;
    *(int *)((ChunkCache->BrickOffsets).Buffer.Data + (long)BrickSzIt._4_4_ * 4) = local_468;
  }
  do {
    if (0x40 < ChunkStream->BitPos + 7) {
      ChunkStream->BitPtr = ChunkStream->BitPtr + (ChunkStream->BitPos >> 3);
      ChunkStream->BitBuf = *(u64 *)ChunkStream->BitPtr;
      ChunkStream->BitPos = ChunkStream->BitPos & 7;
    }
    ChunkStream->BitPos = ChunkStream->BitPos + 7;
    if (0x40 < ChunkStream->BitPos + 1) {
      ChunkStream->BitPtr = ChunkStream->BitPtr + (ChunkStream->BitPos >> 3);
      ChunkStream->BitBuf = *(u64 *)ChunkStream->BitPtr;
      ChunkStream->BitPos = ChunkStream->BitPos & 7;
    }
    uVar4 = ChunkStream->BitBuf >> ((byte)ChunkStream->BitPos & 0x3f) & bitstream::Masks.Arr[1];
    ChunkStream->BitPos = ChunkStream->BitPos + 1;
  } while (uVar4 != 0);
  for (local_478 = (int *)(ChunkCache->BrickOffsets).Buffer.Data;
      local_478 !=
      (int *)((ChunkCache->BrickOffsets).Buffer.Data + (ChunkCache->BrickOffsets).Size * 4);
      local_478 = local_478 + 1) {
    *local_478 = ((int)ChunkStream->BitPtr - (int)(ChunkStream->Stream).Data) +
                 (ChunkStream->BitPos + 7) / 8 + *local_478;
  }
  memcpy(&ChunkCache->ChunkStream,ChunkStream,0x2c);
  return;
}

Assistant:

void
DecompressChunk(bitstream* ChunkStream, chunk_cache* ChunkCache, u64 ChunkAddress, int L)
{
  (void)L;
  u64 Brk = ((ChunkAddress >> 18) & 0x3FFFFFFFFFFull);
  (void)Brk;
  InitRead(ChunkStream, ChunkStream->Stream);
  int NBricks = (int)ReadVarByte(ChunkStream);
  idx2_Assert(NBricks > 0);

  /* decompress and store the brick ids */
  u64 Brick = ReadVarByte(ChunkStream);
  Resize(&ChunkCache->Bricks, NBricks);
  ChunkCache->Bricks[0] = Brick;
  idx2_For (int, I, 1, NBricks)
  {
    Brick += ReadUnary(ChunkStream) + 1;
    ChunkCache->Bricks[I] = Brick;
    idx2_Assert(Brk == (Brick >> L));
  }

  Resize(&ChunkCache->BrickOffsets, NBricks);
  /* decompress and store the brick sizes */
  i32 BrickSize = 0;
  SeekToNextByte(ChunkStream);
  ChunkCache->BrickOffsets[0] = 0;
  idx2_For (int, I, 1, Size(ChunkCache->BrickOffsets))
  {
    ChunkCache->BrickOffsets[I] = (BrickSize += (i32)ReadVarByte(ChunkStream));
  }
  ReadVarByte(ChunkStream); // the size of the last brick (ignored here)
  idx2_ForEach (BrickSzIt, ChunkCache->BrickOffsets)
    *BrickSzIt += (i32)Size(*ChunkStream);
  ChunkCache->ChunkStream = *ChunkStream;
}